

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool iter_new_container_partial_init(roaring_uint32_iterator_t *newit)

{
  uint8_t uVar1;
  uint uVar2;
  roaring_bitmap_t *prVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  
  newit->current_value = 0;
  uVar2 = newit->container_index;
  prVar3 = newit->parent;
  bVar4 = (int)uVar2 < (prVar3->high_low_container).size;
  bVar5 = -1 < (int)uVar2 && bVar4;
  if (-1 < (int)uVar2 && bVar4) {
    newit->has_value = true;
    plVar6 = (long *)(prVar3->high_low_container).containers[uVar2];
    newit->container = plVar6;
    uVar1 = (prVar3->high_low_container).typecodes[uVar2];
    newit->typecode = uVar1;
    newit->highbits = (uint)(prVar3->high_low_container).keys[uVar2] << 0x10;
    if (uVar1 == '\x04') {
      newit->typecode = (uint8_t)plVar6[1];
      plVar6 = (long *)*plVar6;
    }
    newit->container = plVar6;
    return bVar5;
  }
  newit->current_value = 0xffffffff;
  newit->has_value = false;
  return bVar5;
}

Assistant:

CROARING_WARN_UNUSED static bool iter_new_container_partial_init(
    roaring_uint32_iterator_t *newit) {
    newit->current_value = 0;
    if (newit->container_index >= newit->parent->high_low_container.size ||
        newit->container_index < 0) {
        newit->current_value = UINT32_MAX;
        return (newit->has_value = false);
    }
    newit->has_value = true;
    // we precompute container, typecode and highbits so that successive
    // iterators do not have to grab them from odd memory locations
    // and have to worry about the (easily predicted) container_unwrap_shared
    // call.
    newit->container =
        newit->parent->high_low_container.containers[newit->container_index];
    newit->typecode =
        newit->parent->high_low_container.typecodes[newit->container_index];
    newit->highbits =
        ((uint32_t)
             newit->parent->high_low_container.keys[newit->container_index])
        << 16;
    newit->container =
        container_unwrap_shared(newit->container, &(newit->typecode));
    return true;
}